

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

enable_if_t<HasSize<span<const_Normal3<float>_>_>::value_&&_HasData<span<const_Normal3<float>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<(ostream *os,span<const_pbrt::Normal3<float>_> *v)

{
  ulong uVar1;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  if (v->n != 0) {
    uVar1 = 0;
    do {
      internal::ToString3<float>(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0.0);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (uVar1 < v->n - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < v->n);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}